

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

OptionsType * __thiscall
google::protobuf::DescriptorBuilder::AllocateOptionsImpl<google::protobuf::EnumDescriptor>
          (DescriptorBuilder *this,string_view name_scope,string_view element_name,Proto *proto,
          Span<const_int> options_path,string_view option_name,FlatAllocator *alloc)

{
  uint uVar1;
  PointerT<google::protobuf::EnumOptions> pEVar2;
  Span<const_int> path;
  bool bVar3;
  int iVar4;
  Symbol SVar5;
  const_reference pUVar6;
  FieldDescriptor *pFVar7;
  pointer to;
  DescriptorPool *this_00;
  int iVar8;
  FileOptions *c;
  Symbol extendee;
  OptionsType *unaff_R13;
  EnumOptions *p;
  undefined1 *msg;
  SooRep *this_01;
  string_view from;
  string_view element_name_00;
  undefined1 local_118 [16];
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [3];
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  uVar1 = (proto->field_0)._impl_._has_bits_.has_bits_[0];
  msg = (undefined1 *)(proto->field_0)._impl_.options_;
  if (((EnumOptions *)msg == (EnumOptions *)0x0 & (byte)uVar1 >> 1) == 1) {
    internal::protobuf_assumption_failed
              ("!value || _impl_.options_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x3d69);
  }
  if ((uVar1 & 2) == 0) {
    return (OptionsType *)_EnumOptions_default_instance_;
  }
  if ((EnumOptions *)msg == (EnumOptions *)0x0) {
    msg = _EnumOptions_default_instance_;
  }
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
    AllocateOptionsImpl<google::protobuf::EnumDescriptor>((DescriptorBuilder *)local_118);
LAB_0024c9dc:
    AllocateOptionsImpl<google::protobuf::EnumDescriptor>();
LAB_0024c9e6:
    AllocateOptionsImpl<google::protobuf::EnumDescriptor>((DescriptorBuilder *)local_118);
  }
  else {
    pEVar2 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).pointers_.payload_.super_Base<google::protobuf::EnumOptions>.value;
    iVar8 = (alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).used_.payload_.super_Base<google::protobuf::EnumOptions>.value;
    unaff_R13 = (OptionsType *)(long)iVar8;
    iVar8 = iVar8 + 1;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<google::protobuf::EnumOptions>.value = iVar8;
    if ((alloc->
        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ).total_.payload_.super_Base<google::protobuf::EnumOptions>.value < iVar8)
    goto LAB_0024c9dc;
    to = (pointer)element_name._M_len;
    c = (FileOptions *)element_name._M_str;
    bVar3 = EnumOptions::IsInitializedImpl((MessageLite *)msg);
    if (!bVar3) {
      local_60.piece_._M_len = 1;
      local_60.piece_._M_str = ".";
      local_118._0_8_ = (pointer)name_scope._M_len;
      local_118._8_8_ = (Tables *)name_scope._M_str;
      local_90.piece_._M_len = element_name._M_len;
      local_90.piece_._M_str = element_name._M_str;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_b0,(lts_20250127 *)local_118,&local_60,&local_90,(AlphaNum *)c);
      element_name_00._M_str = local_b0._M_dataplus._M_p;
      element_name_00._M_len = local_b0._M_string_length;
      AddError(this,element_name_00,(Message *)msg,OPTION_NAME,
               "Uninterpreted option is missing name or value.");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
        return (OptionsType *)_EnumOptions_default_instance_;
      }
      operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1))
      ;
      return (OptionsType *)_EnumOptions_default_instance_;
    }
    unaff_R13 = pEVar2 + (long)unaff_R13;
    MessageLite::SerializeAsString_abi_cxx11_((string *)local_118,(MessageLite *)msg);
    from._M_str = (char *)unaff_R13;
    from._M_len = local_118._0_8_;
    bVar3 = internal::ParseNoReflection((internal *)local_118._8_8_,from,(MessageLite *)to);
    if ((FileDescriptor *)local_118._0_8_ != (FileDescriptor *)local_108) {
      operator_delete((void *)local_118._0_8_,local_108._0_8_ + 1);
    }
    if (!bVar3) goto LAB_0024c9e6;
    if (0 < *(int *)((long)&unaff_R13->field_0 + 0x28)) {
      path.len_ = (size_type)msg;
      path.ptr_ = (pointer)options_path.len_;
      anon_unknown_24::OptionsToInterpret::OptionsToInterpret
                ((OptionsToInterpret *)local_118,name_scope,element_name,path,
                 (Message *)options_path.ptr_,&unaff_R13->super_Message);
      std::
      vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ::push_back(&this->options_to_interpret_,(value_type *)local_118);
      if ((pointer)local_e8[1]._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_e8[1]._0_8_,local_e8[2]._0_8_ - local_e8[1]._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._16_8_ != local_e8) {
        operator_delete((void *)local_108._16_8_,local_e8[0]._M_allocated_capacity + 1);
      }
      if ((FileDescriptor *)local_118._0_8_ != (FileDescriptor *)local_108) {
        operator_delete((void *)local_118._0_8_,local_108._0_8_ + 1);
      }
    }
    msg = (undefined1 *)
          (((EnumOptions *)msg)->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)msg & 1) == 0) {
      this_01 = (SooRep *)&UnknownFieldSet::default_instance()::instance;
      goto LAB_0024c83d;
    }
  }
  this_01 = (SooRep *)(((ulong)msg & 0xfffffffffffffffe) + 8);
LAB_0024c83d:
  iVar8 = internal::SooRep::size
                    (this_01,(undefined1  [16])
                             ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
  if (((iVar8 != 0) &&
      (SVar5 = DescriptorPool::Tables::FindSymbol(this->tables_,option_name),
      (SVar5.ptr_)->symbol_type_ == '\x01')) &&
     (iVar8 = internal::SooRep::size
                        (this_01,(undefined1  [16])
                                 ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0), 0 < iVar8)) {
    iVar8 = 0;
    do {
      this_00 = this->pool_;
      if (this_00->mutex_ != (Mutex *)0x0) {
        absl::lts_20250127::Mutex::AssertHeld(this_00->mutex_);
        this_00 = this->pool_;
      }
      extendee.ptr_ = &((Descriptor *)0x0)->super_SymbolBase;
      if ((SVar5.ptr_)->symbol_type_ == '\x01') {
        extendee = SVar5;
      }
      pUVar6 = RepeatedField<google::protobuf::UnknownField>::Get
                         ((RepeatedField<google::protobuf::UnknownField> *)this_01,iVar8);
      pFVar7 = DescriptorPool::InternalFindExtensionByNumberNoLock
                         (this_00,(Descriptor *)extendee.ptr_,pUVar6->number_);
      if (pFVar7 != (FieldDescriptor *)0x0) {
        local_118._0_8_ = pFVar7->file_;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
        ::erase<google::protobuf::FileDescriptor_const*>
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                    *)&this->unused_dependency_,
                   (key_arg<const_google::protobuf::FileDescriptor_*> *)local_118);
      }
      iVar8 = iVar8 + 1;
      iVar4 = internal::SooRep::size
                        (this_01,(undefined1  [16])
                                 ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
    } while (iVar8 < iVar4);
  }
  return unaff_R13;
}

Assistant:

const typename DescriptorT::OptionsType* DescriptorBuilder::AllocateOptionsImpl(
    absl::string_view name_scope, absl::string_view element_name,
    const typename DescriptorT::Proto& proto,
    absl::Span<const int> options_path, absl::string_view option_name,
    internal::FlatAllocator& alloc) {
  if (!proto.has_options()) {
    return &DescriptorT::OptionsType::default_instance();
  }
  const typename DescriptorT::OptionsType& orig_options = proto.options();

  auto* options = alloc.AllocateArray<typename DescriptorT::OptionsType>(1);

  if (!orig_options.IsInitialized()) {
    AddError(absl::StrCat(name_scope, ".", element_name), orig_options,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    return &DescriptorT::OptionsType::default_instance();
  }

  const bool parse_success =
      internal::ParseNoReflection(orig_options.SerializeAsString(), *options);
  ABSL_DCHECK(parse_success);

  // Don't add to options_to_interpret_ unless there were uninterpreted
  // options.  This not only avoids unnecessary work, but prevents a
  // bootstrapping problem when building descriptors for descriptor.proto.
  // descriptor.proto does not contain any uninterpreted options, but
  // attempting to interpret options anyway will cause
  // OptionsType::GetDescriptor() to be called which may then deadlock since
  // we're still trying to build it.
  if (options->uninterpreted_option_size() > 0) {
    options_to_interpret_.push_back(OptionsToInterpret(
        name_scope, element_name, options_path, &orig_options, options));
  }

  // If the custom option is in unknown fields, no need to interpret it.
  // Remove the dependency file from unused_dependency.
  const UnknownFieldSet& unknown_fields = orig_options.unknown_fields();
  if (!unknown_fields.empty()) {
    // Can not use options->GetDescriptor() which may case deadlock.
    Symbol msg_symbol = tables_->FindSymbol(option_name);
    if (msg_symbol.type() == Symbol::MESSAGE) {
      for (int i = 0; i < unknown_fields.field_count(); ++i) {
        assert_mutex_held(pool_);
        const FieldDescriptor* field =
            pool_->InternalFindExtensionByNumberNoLock(
                msg_symbol.descriptor(), unknown_fields.field(i).number());
        if (field) {
          unused_dependency_.erase(field->file());
        }
      }
    }
  }
  return options;
}